

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimizer_engine.cpp
# Opt level: O1

void __thiscall
ram::MinimizerEngine::MinimizerEngine
          (MinimizerEngine *this,shared_ptr<thread_pool::ThreadPool> *thread_pool,uint32_t k,
          uint32_t w,uint32_t bandwidth,uint32_t chain,uint32_t matches,uint32_t gap)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint uVar3;
  uint uVar4;
  allocator_type local_1e;
  undefined1 local_1d;
  int local_1c;
  
  uVar3 = k + (k == 0);
  uVar4 = 0x1f;
  if (uVar3 < 0x1f) {
    uVar4 = uVar3;
  }
  this->k_ = uVar4;
  this->w_ = w;
  this->bandwidth_ = bandwidth;
  this->chain_ = chain;
  this->matches_ = matches;
  this->gap_ = (ulong)gap;
  this->occurrence_ = 0xffffffff;
  uVar3 = 0xe;
  if (uVar4 * 2 < 0xe) {
    uVar3 = uVar4 * 2;
  }
  std::vector<ram::MinimizerEngine::Index,_std::allocator<ram::MinimizerEngine::Index>_>::vector
            (&this->index_,(ulong)(uint)(1 << ((byte)uVar3 & 0x1f)),&local_1e);
  peVar1 = (thread_pool->super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_1c = 1;
    (this->thread_pool_).super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<thread_pool::ThreadPool,std::allocator<thread_pool::ThreadPool>,int>
              (&(this->thread_pool_).
                super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (ThreadPool **)&this->thread_pool_,(allocator<thread_pool::ThreadPool> *)&local_1d,
               &local_1c);
  }
  else {
    (this->thread_pool_).super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    p_Var2 = (thread_pool->super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    (this->thread_pool_).super___shared_ptr<thread_pool::ThreadPool,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
  }
  return;
}

Assistant:

MinimizerEngine::MinimizerEngine(
    std::shared_ptr<thread_pool::ThreadPool> thread_pool,
    std::uint32_t k,
    std::uint32_t w,
    std::uint32_t bandwidth,
    std::uint32_t chain,
    std::uint32_t matches,
    std::uint32_t gap)
    : k_(std::min(std::max(k, 1U), 31U)),
      w_(w),
      bandwidth_(bandwidth),
      chain_(chain),
      matches_(matches),
      gap_(gap),
      occurrence_(-1),
      index_(1U << std::min(14U, 2 * k_)),
      thread_pool_(thread_pool ?
          thread_pool :
          std::make_shared<thread_pool::ThreadPool>(1)) {}